

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

int nk_tree_base(nk_context *ctx,nk_tree_type type,nk_image *img,char *title,
                nk_collapse_states initial_state,char *hash,int len,int line)

{
  nk_window *win;
  long lVar1;
  nk_hash name;
  int iVar2;
  nk_uint *state;
  nk_table *pnVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  undefined4 in_register_00000084;
  bool bVar8;
  
  state = (nk_uint *)CONCAT44(in_register_00000084,initial_state);
  win = ctx->current;
  if (hash == (char *)0x0) {
    lVar5 = 0;
    if ((title != (char *)0x0) && (*title != '\0')) {
      lVar5 = 0;
      do {
        lVar1 = lVar5 + 1;
        lVar5 = lVar5 + 1;
      } while (title[lVar1] != '\0');
    }
    len = (int)lVar5;
    hash = title;
  }
  name = nk_murmur_hash(hash,len,line);
  pnVar3 = win->tables;
  do {
    if (pnVar3 == (nk_table *)0x0) {
      state = (nk_uint *)0x0;
      break;
    }
    uVar6 = (ulong)pnVar3->size;
    bVar8 = uVar6 != 0;
    if (uVar6 == 0) {
LAB_0011e289:
      pnVar3 = pnVar3->next;
    }
    else {
      if (pnVar3->keys[0] == name) {
        bVar8 = true;
        uVar7 = 0;
      }
      else {
        uVar4 = 0;
        do {
          if (uVar6 - 1 == uVar4) {
            bVar8 = uVar4 + 1 < uVar6;
            goto LAB_0011e289;
          }
          uVar7 = uVar4 + 1;
          lVar5 = uVar4 + 1;
          uVar4 = uVar7;
        } while (pnVar3->keys[lVar5] != name);
        bVar8 = uVar7 < uVar6;
      }
      pnVar3->seq = win->seq;
      state = pnVar3->values + uVar7;
    }
  } while (!bVar8);
  if (state == (nk_uint *)0x0) {
    state = nk_add_value(ctx,win,name,(nk_uint)pnVar3);
    *state = initial_state;
  }
  iVar2 = nk_tree_state_base(ctx,type,img,title,state);
  return iVar2;
}

Assistant:

NK_INTERN int
nk_tree_base(struct nk_context *ctx, enum nk_tree_type type,
struct nk_image *img, const char *title, enum nk_collapse_states initial_state,
const char *hash, int len, int line)
{
struct nk_window *win = ctx->current;
int title_len = 0;
nk_hash tree_hash = 0;
nk_uint *state = 0;

/* retrieve tree state from internal widget state tables */
if (!hash) {
title_len = (int)nk_strlen(title);
tree_hash = nk_murmur_hash(title, (int)title_len, (nk_hash)line);
} else tree_hash = nk_murmur_hash(hash, len, (nk_hash)line);
state = nk_find_value(win, tree_hash);
if (!state) {
state = nk_add_value(ctx, win, tree_hash, 0);
*state = initial_state;
}
return nk_tree_state_base(ctx, type, img, title, (enum nk_collapse_states*)state);
}